

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

void __thiscall wabt::TypeChecker::PrintError(TypeChecker *this,char *fmt,...)

{
  long lVar1;
  int iVar2;
  size_t __maxlen;
  char *__s;
  undefined8 uStack_190;
  char local_188 [8];
  char fixed_buf [128];
  undefined8 local_58;
  va_list args;
  undefined8 local_38;
  va_list args_copy;
  
  if ((this->error_callback_).super__Function_base._M_manager != (_Manager_type)0x0) {
    local_58 = 0x3000000010;
    args[0]._0_8_ = &stack0x00000008;
    args[0].overflow_arg_area = fixed_buf + 0x78;
    local_38 = 0x3000000010;
    __s = local_188;
    uStack_190 = 0x1c65c6;
    args_copy[0]._0_8_ = args[0]._0_8_;
    args_copy[0].overflow_arg_area = args[0].overflow_arg_area;
    iVar2 = vsnprintf(__s,0x80,fmt,&local_58);
    __maxlen = (long)iVar2 + 1;
    if (0x80 < __maxlen) {
      lVar1 = -((long)iVar2 + 0x10U & 0xfffffffffffffff0);
      __s = local_188 + lVar1;
      *(undefined8 *)((long)&uStack_190 + lVar1) = 0x1c65f5;
      vsnprintf(__s,__maxlen,fmt,&local_38);
    }
    __s[-8] = '\0';
    __s[-7] = 'f';
    __s[-6] = '\x1c';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    std::function<void_(const_char_*)>::operator()(&this->error_callback_,__s);
  }
  return;
}

Assistant:

void TypeChecker::PrintError(const char* fmt, ...) {
  if (error_callback_) {
    WABT_SNPRINTF_ALLOCA(buffer, length, fmt);
    error_callback_(buffer);
  }
}